

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyHttpImplPrivate::replyDownloadData(QNetworkReplyHttpImplPrivate *this,QByteArray d)

{
  QDecompressHelper *this_00;
  __atomic_base<int> _Var1;
  QNetworkReplyHttpImpl *this_01;
  element_type *peVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  qint64 qVar6;
  char *pcVar7;
  ssize_t sVar8;
  long lVar9;
  longlong _t2;
  size_t in_RCX;
  QByteArray *in_RSI;
  _Storage<long_long,_true> *this_02;
  long in_FS_OFFSET;
  QByteArrayView value;
  QByteArrayView QVar10;
  optional<long_long> oVar11;
  QArrayDataPointer<char16_t> local_88;
  _Storage<long_long,_true> local_70 [3];
  _Storage<long_long,_true> local_58;
  char *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QNetworkReplyHttpImpl **)&(this->super_QNetworkReplyPrivate).field_0x8;
  cVar3 = QIODevice::isOpen();
  if (cVar3 == '\0') goto LAB_00200a26;
  lVar9 = (in_RSI->d).size;
  if (((this->cacheEnabled == true) &&
      ((this->super_QNetworkReplyPrivate).operation - HeadOperation < 2)) &&
     (this->cacheSaveDevice == (QIODevice *)0x0)) {
    initCacheSaveDevice(this);
  }
  this_00 = &this->decompressHelper;
  bVar4 = QDecompressHelper::isValid(this_00);
  if (bVar4) {
    bVar4 = QDecompressHelper::isCountingBytes(this_00);
    if (bVar4) {
      lVar5 = QDecompressHelper::uncompressedSize(this_00);
    }
    else {
      lVar5 = -1;
    }
    QDecompressHelper::feed(this_00,in_RSI);
    bVar4 = QDecompressHelper::isValid(this_00);
    if (bVar4) {
      bVar4 = isHttpRedirectResponse(this);
      if (!bVar4) {
        bVar4 = QDecompressHelper::isCountingBytes(this_00);
        if (bVar4) {
          qVar6 = QDecompressHelper::uncompressedSize(this_00);
          this->bytesDownloaded = this->bytesDownloaded + (qVar6 - lVar5);
        }
        setupTransferTimeout(this);
      }
      if (this->synchronous != true) goto LAB_002008ab;
      local_58._M_value = (longlong)(in_RSI->d).d;
      pcStack_50 = (in_RSI->d).ptr;
      (in_RSI->d).d = (Data *)0x0;
      (in_RSI->d).ptr = (char *)0x0;
      local_48 = (in_RSI->d).size;
      (in_RSI->d).size = 0;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      lVar5 = 0;
      do {
        bVar4 = QDecompressHelper::hasData(this_00);
        if (!bVar4) {
          QByteArray::resize((longlong)in_RSI);
          QDecompressHelper::clear(this_00);
          goto LAB_002008ab;
        }
        if ((in_RSI->d).size + 0x4000 < 0) {
          this_02 = &local_58;
          QCoreApplication::translate
                    ((char *)&this_02->_M_value,"QHttp","Data downloaded is too large to store",0);
          error(this,UnknownContentError,(QString *)this_02);
          goto LAB_0020087e;
        }
        QByteArray::resize((longlong)in_RSI);
        pcVar7 = QByteArray::data(in_RSI);
        sVar8 = QDecompressHelper::read(this_00,(int)pcVar7 + (int)lVar5,(void *)0x4000,in_RCX);
        lVar5 = lVar5 + sVar8;
        bVar4 = QDecompressHelper::isValid(this_00);
      } while (bVar4);
    }
    this_02 = local_70;
    QCoreApplication::translate((char *)&this_02->_M_value,"QHttp","Decompression failed: %1",0);
    QDecompressHelper::errorString((QString *)&local_88,this_00);
    QString::arg<QString,_true>
              ((QString *)&local_58,(QString *)this_02,(QString *)&local_88,0,(QChar)0x20);
    error(this,UnknownContentError,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
LAB_0020087e:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_02);
    QDecompressHelper::clear(this_00);
  }
  else {
LAB_002008ab:
    if (this->cacheSaveDevice != (QIODevice *)0x0) {
      bVar4 = QDecompressHelper::isValid(this_00);
      if (!bVar4) {
        QIODevice::write((QByteArray *)this->cacheSaveDevice);
      }
    }
    bVar4 = QDecompressHelper::isValid(this_00);
    if (!bVar4) {
      bVar4 = isHttpRedirectResponse(this);
      if (!bVar4) {
        QIODevicePrivate::QRingBufferRef::append
                  ((QRingBufferRef *)&(this->super_QNetworkReplyPrivate).field_0x90,in_RSI);
        this->bytesDownloaded = this->bytesDownloaded + lVar9;
        setupTransferTimeout(this);
      }
    }
    this->bytesBuffered = this->bytesBuffered + lVar9;
    peVar2 = (this->pendingDownloadDataEmissions).
             super___shared_ptr<QAtomicInt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    LOCK();
    _Var1._M_i = (peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i;
    (peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0 ||
        SBORROW4(_Var1._M_i,1) !=
        (peVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i < 0) {
      bVar4 = isHttpRedirectResponse(this);
      if (!bVar4) {
        if (this->lastReadyReadEmittedSize == this->bytesDownloaded) {
          if ((this->super_QNetworkReplyPrivate).readBufferMaxSize != 0) {
            QNetworkReplyHttpImpl::readBufferFreed(this_01,lVar9);
          }
        }
        else {
          this->lastReadyReadEmittedSize = this->bytesDownloaded;
          local_58._M_value = (longlong)&DAT_aaaaaaaaaaaaaaaa;
          pcStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)local_70);
          QVar10 = QHttpHeaders::value((QHttpHeaders *)local_70,ContentLength,
                                       (QByteArrayView)ZEXT816(0));
          value.m_data = QVar10.m_data;
          value.m_size = (qsizetype)value.m_data;
          oVar11 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar10.m_size,value);
          local_58._M_value =
               oVar11.super__Optional_base<long_long,_true,_true>._M_payload.
               super__Optional_payload_base<long_long>._M_payload;
          pcStack_50 = (char *)CONCAT71(pcStack_50._1_7_,
                                        oVar11.super__Optional_base<long_long,_true,_true>.
                                        _M_payload.super__Optional_payload_base<long_long>.
                                        _M_engaged);
          QHttpHeaders::~QHttpHeaders((QHttpHeaders *)local_70);
          QIODevice::readyRead();
          cVar3 = QElapsedTimer::isValid();
          if (cVar3 != '\0') {
            lVar9 = QElapsedTimer::elapsed();
            if (99 < lVar9) {
              bVar4 = QDecompressHelper::isValid(this_00);
              if (bVar4) {
                bVar4 = QDecompressHelper::isCountingBytes(this_00);
                if (!bVar4) goto LAB_00200a26;
              }
              QElapsedTimer::start();
              qVar6 = this->bytesDownloaded;
              local_70[0]._M_value._0_4_ = 0xffffffff;
              _t2 = std::optional<long_long>::value_or<int>
                              ((optional<long_long> *)&local_58,(int *)&local_70[0]._M_value);
              QNetworkReply::downloadProgress((QNetworkReply *)this_01,qVar6,_t2);
            }
          }
        }
      }
    }
  }
LAB_00200a26:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImplPrivate::replyDownloadData(QByteArray d)
{
    Q_Q(QNetworkReplyHttpImpl);

    // If we're closed just ignore this data
    if (!q->isOpen())
        return;

    // cache this, we need it later and it's invalidated when dealing with compressed data
    auto dataSize = d.size();

    if (cacheEnabled && isCachingAllowed() && !cacheSaveDevice)
        initCacheSaveDevice();

    if (decompressHelper.isValid()) {
        qint64 uncompressedBefore = -1;
        if (decompressHelper.isCountingBytes())
            uncompressedBefore = decompressHelper.uncompressedSize();

        decompressHelper.feed(std::move(d));

        if (!decompressHelper.isValid()) {
            error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                  QCoreApplication::translate("QHttp", "Decompression failed: %1")
                          .arg(decompressHelper.errorString()));
            decompressHelper.clear();
            return;
        }

        if (!isHttpRedirectResponse()) {
            if (decompressHelper.isCountingBytes())
                bytesDownloaded += (decompressHelper.uncompressedSize() - uncompressedBefore);
            setupTransferTimeout();
        }

        if (synchronous) {
            d = QByteArray();
            const qsizetype increments = 16 * 1024;
            qint64 bytesRead = 0;
            while (decompressHelper.hasData()) {
                quint64 nextSize = quint64(d.size()) + quint64(increments);
                if (nextSize > quint64(std::numeric_limits<QByteArray::size_type>::max())) {
                    error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                          QCoreApplication::translate("QHttp",
                                                      "Data downloaded is too large to store"));
                    decompressHelper.clear();
                    return;
                }
                d.resize(nextSize);
                bytesRead += decompressHelper.read(d.data() + bytesRead, increments);
                if (!decompressHelper.isValid()) {
                    error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                          QCoreApplication::translate("QHttp", "Decompression failed: %1")
                                  .arg(decompressHelper.errorString()));
                    decompressHelper.clear();
                    return;
                }
            }
            d.resize(bytesRead);
            // we're synchronous so we're not calling this function again; reset the decompressHelper
            decompressHelper.clear();
        }
    }

    // This is going to look a little strange. When downloading data while a
    // HTTP redirect is happening (and enabled), we write the redirect
    // response to the cache. However, we do not append it to our internal
    // buffer as that will contain the response data only for the final
    // response
    // Note: For compressed data this is done in readData()
    if (cacheSaveDevice && !decompressHelper.isValid()) {
        cacheSaveDevice->write(d);
    }

    // if decompressHelper is valid then we have compressed data, and this is handled above
    if (!decompressHelper.isValid() && !isHttpRedirectResponse()) {
        buffer.append(d);
        bytesDownloaded += dataSize;
        setupTransferTimeout();
    }
    bytesBuffered += dataSize;

    int pendingSignals = pendingDownloadDataEmissions->fetchAndSubAcquire(1) - 1;
    if (pendingSignals > 0) {
        // Some more signal emissions to this slot are pending.
        // Instead of writing the downstream data, we wait
        // and do it in the next call we get
        // (signal comppression)
        return;
    }

    if (isHttpRedirectResponse())
        return;

    // This can occur when downloading compressed data as some of the data may be the content
    // encoding's header. Don't emit anything for this.
    if (lastReadyReadEmittedSize == bytesDownloaded) {
        if (readBufferMaxSize)
            emit q->readBufferFreed(dataSize);
        return;
    }
    lastReadyReadEmittedSize = bytesDownloaded;

    const auto totalSizeOpt = QNetworkHeadersPrivate::toInt(
            headers().value(QHttpHeaders::WellKnownHeader::ContentLength));

    emit q->readyRead();
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval
        && (!decompressHelper.isValid() || decompressHelper.isCountingBytes())) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, totalSizeOpt.value_or(-1));
    }
}